

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::Impl::readEmbedFromSearchPath
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,Impl *this,PathPtr path)

{
  ReadableDirectory **ppRVar1;
  ReadableDirectory **ppRVar2;
  NullableValue<kj::Array<const_unsigned_char>_> _module279;
  NullableValue<kj::Array<const_unsigned_char>_> local_70;
  NullableValue<kj::Array<const_unsigned_char>_> local_50;
  
  ppRVar2 = (this->searchPath).builder.ptr;
  ppRVar1 = (this->searchPath).builder.pos;
  while( true ) {
    if (ppRVar2 == ppRVar1) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    readEmbed((Maybe<kj::Array<const_unsigned_char>_> *)&local_50,this,*ppRVar2,path);
    local_70.isSet = local_50.isSet;
    if (local_50.isSet == true) {
      local_70.field_1.value.ptr = local_50.field_1.value.ptr;
      local_70.field_1.value.size_ = local_50.field_1.value.size_;
      local_70.field_1.value.disposer = local_50.field_1.value.disposer;
      local_50.field_1.value.ptr = (uchar *)0x0;
      local_50.field_1.value.size_ = 0;
    }
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue(&local_50);
    if (local_70.isSet != false) break;
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue(&local_70);
    ppRVar2 = ppRVar2 + 1;
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = local_70.field_1.value.ptr;
  (__return_storage_ptr__->ptr).field_1.value.size_ = local_70.field_1.value.size_;
  (__return_storage_ptr__->ptr).field_1.value.disposer = local_70.field_1.value.disposer;
  local_70.field_1.value.ptr = (uchar *)0x0;
  local_70.field_1.value.size_ = 0;
  kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue(&local_70);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> ModuleLoader::Impl::readEmbedFromSearchPath(kj::PathPtr path) {
  for (auto candidate: searchPath) {
    KJ_IF_SOME(module, readEmbed(*candidate, path)) {
      return kj::mv(module);
    }
  }
  return kj::none;
}